

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

bool __thiscall FSerializer::BeginArray(FSerializer *this,char *name)

{
  FReader *this_00;
  bool bVar1;
  FJSONObject local_48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_30;
  Value *val;
  char *local_20;
  char *name_local;
  FSerializer *this_local;
  
  local_20 = name;
  name_local = (char *)this;
  bVar1 = isWriting(this);
  if (bVar1) {
    WriteKey(this,local_20);
    FWriter::StartArray(this->w);
    val._7_1_ = 0;
    TArray<bool,_bool>::Push(&this->w->mInObject,(bool *)((long)&val + 7));
  }
  else {
    local_30 = FReader::FindKey(this->r,local_20);
    if (local_30 == (Value *)0x0) {
      return false;
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(local_30);
    if (!bVar1) {
      __assert_fail("val->IsArray()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                    ,0x28b,"bool FSerializer::BeginArray(const char *)");
    }
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsArray(local_30);
    if (!bVar1) {
      Printf("\x1cGArray expected for \'%s\'",local_20);
      this->mErrors = this->mErrors + 1;
      return false;
    }
    this_00 = this->r;
    FJSONObject::FJSONObject(&local_48,local_30);
    TArray<FJSONObject,_FJSONObject>::Push(&this_00->mObjects,&local_48);
  }
  return true;
}

Assistant:

bool FSerializer::BeginArray(const char *name)
{
	if (isWriting())
	{
		WriteKey(name);
		w->StartArray();
		w->mInObject.Push(false);
	}
	else
	{
		auto val = r->FindKey(name);
		if (val != nullptr)
		{
			assert(val->IsArray());
			if (val->IsArray())
			{
				r->mObjects.Push(FJSONObject(val));
			}
			else
			{
				Printf(TEXTCOLOR_RED "Array expected for '%s'", name);
				mErrors++;
				return false;
			}
		}
		else
		{
			return false;
		}
	}
	return true;
}